

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O2

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,char *dir)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  string sourceDirectory;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string((string *)&sourceDirectory,dir,(allocator *)&cmCTestLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Check directory: ");
  poVar2 = std::operator<<(poVar2,(string *)&sourceDirectory);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,300,local_1b0[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::append((char *)&sourceDirectory);
  bVar1 = cmsys::SystemTools::FileExists(sourceDirectory._M_dataplus._M_p);
  if (bVar1) {
    iVar3 = 2;
  }
  else {
    std::__cxx11::string::assign((char *)&sourceDirectory);
    std::__cxx11::string::append((char *)&sourceDirectory);
    bVar1 = cmsys::SystemTools::FileExists(sourceDirectory._M_dataplus._M_p);
    if (bVar1) {
      iVar3 = 1;
    }
    else {
      std::__cxx11::string::assign((char *)&sourceDirectory);
      std::__cxx11::string::append((char *)&sourceDirectory);
      bVar1 = cmsys::SystemTools::FileExists(sourceDirectory._M_dataplus._M_p);
      if (bVar1) {
        iVar3 = 3;
      }
      else {
        std::__cxx11::string::assign((char *)&sourceDirectory);
        std::__cxx11::string::append((char *)&sourceDirectory);
        bVar1 = cmsys::SystemTools::FileExists(sourceDirectory._M_dataplus._M_p);
        if (bVar1) {
          iVar3 = 4;
        }
        else {
          std::__cxx11::string::assign((char *)&sourceDirectory);
          std::__cxx11::string::append((char *)&sourceDirectory);
          bVar1 = cmsys::SystemTools::FileExists(sourceDirectory._M_dataplus._M_p);
          if (bVar1) {
            iVar3 = 5;
          }
          else {
            std::__cxx11::string::assign((char *)&sourceDirectory);
            std::__cxx11::string::append((char *)&sourceDirectory);
            bVar1 = cmsys::SystemTools::FileExists(sourceDirectory._M_dataplus._M_p);
            if (bVar1) {
              iVar3 = 6;
            }
            else {
              std::__cxx11::string::assign((char *)&sourceDirectory);
              std::__cxx11::string::append((char *)&sourceDirectory);
              bVar1 = cmsys::SystemTools::FileExists(sourceDirectory._M_dataplus._M_p);
              iVar3 = 6;
              if (!bVar1) {
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&sourceDirectory);
  return iVar3;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const char* dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG, "Check directory: "
    << sourceDirectory << std::endl, this->Quiet);
  sourceDirectory += "/.svn";
  if ( cmSystemTools::FileExists(sourceDirectory.c_str()) )
    {
    return cmCTestUpdateHandler::e_SVN;
    }
  sourceDirectory = dir;
  sourceDirectory += "/CVS";
  if ( cmSystemTools::FileExists(sourceDirectory.c_str()) )
    {
    return cmCTestUpdateHandler::e_CVS;
    }
  sourceDirectory = dir;
  sourceDirectory += "/.bzr";
  if ( cmSystemTools::FileExists(sourceDirectory.c_str()) )
    {
    return cmCTestUpdateHandler::e_BZR;
    }
  sourceDirectory = dir;
  sourceDirectory += "/.git";
  if ( cmSystemTools::FileExists(sourceDirectory.c_str()) )
    {
    return cmCTestUpdateHandler::e_GIT;
    }
  sourceDirectory = dir;
  sourceDirectory += "/.hg";
  if ( cmSystemTools::FileExists(sourceDirectory.c_str()) )
    {
    return cmCTestUpdateHandler::e_HG;
    }
  sourceDirectory = dir;
  sourceDirectory += "/.p4";
  if ( cmSystemTools::FileExists(sourceDirectory.c_str()) )
    {
    return cmCTestUpdateHandler::e_P4;
    }
  sourceDirectory = dir;
  sourceDirectory += "/.p4config";
  if ( cmSystemTools::FileExists(sourceDirectory.c_str()) )
    {
    return cmCTestUpdateHandler::e_P4;
    }
  return cmCTestUpdateHandler::e_UNKNOWN;
}